

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

ScriptPubKeyMan * __thiscall
wallet::CWallet::GetScriptPubKeyMan(CWallet *this,OutputType *type,bool internal)

{
  long lVar1;
  bool bVar2;
  pointer ppVar3;
  byte in_DL;
  _Self *in_RDI;
  long in_FS_OFFSET;
  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  *spk_managers;
  const_iterator it;
  _Rb_tree_const_iterator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>
  *in_stack_ffffffffffffffa8;
  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  *this_00;
  ScriptPubKeyMan *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_DL & 1) == 0) {
    this_00 = (map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
               *)(in_RDI + 0x22);
  }
  else {
    this_00 = (map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
               *)(in_RDI + 0x28);
  }
  std::
  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  ::find(this_00,(key_type *)in_stack_ffffffffffffffa8);
  std::
  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  ::end(this_00);
  bVar2 = std::operator==(in_RDI,(_Self *)this_00);
  if (bVar2) {
    local_20 = (ScriptPubKeyMan *)0x0;
  }
  else {
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>::
             operator->(in_stack_ffffffffffffffa8);
    local_20 = ppVar3->second;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

ScriptPubKeyMan* CWallet::GetScriptPubKeyMan(const OutputType& type, bool internal) const
{
    const std::map<OutputType, ScriptPubKeyMan*>& spk_managers = internal ? m_internal_spk_managers : m_external_spk_managers;
    std::map<OutputType, ScriptPubKeyMan*>::const_iterator it = spk_managers.find(type);
    if (it == spk_managers.end()) {
        return nullptr;
    }
    return it->second;
}